

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

void Eigen::internal::
     nnls_householder_qr_inplace_solve<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,__1,_0,__1,__1> *mat,Matrix<float,__1,_1,_0,__1,_1> *hCoeffs,
               Matrix<float,__1,_1,_0,__1,_1> *c,Index *rank)

{
  Index *this;
  Index IVar1;
  Index IVar2;
  VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *h;
  Type local_250;
  Type local_218;
  Type local_1e0;
  Type local_1a8;
  Type local_170;
  HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
  local_138;
  TransposeReturnType local_b0;
  VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *local_28;
  Index *rank_local;
  Matrix<float,__1,_1,_0,__1,_1> *c_local;
  Matrix<float,__1,_1,_0,__1,_1> *hCoeffs_local;
  Matrix<float,__1,__1,_0,__1,__1> *mat_local;
  
  local_28 = (VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *)rank;
  rank_local = (Index *)c;
  c_local = hCoeffs;
  hCoeffs_local = (Matrix<float,__1,_1,_0,__1,_1> *)mat;
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  IVar2 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)rank_local);
  if (IVar1 != IVar2) {
    __assert_fail("mat.rows() == c.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x122,
                  "void Eigen::internal::nnls_householder_qr_inplace_solve(const MatrixQR &, const HCoeffs &, Dest &, typename MatrixQR::Index &) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, Dest = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)hCoeffs_local);
  IVar2 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)c_local);
  if (IVar1 == IVar2) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)hCoeffs_local);
    this = rank_local;
    if ((long)(local_28->super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
              super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
              .m_data <= IVar1) {
      h = local_28;
      DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::leftCols<long>
                (&local_170,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)hCoeffs_local,
                 (long)(local_28->
                       super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
                       super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                       .m_data);
      DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_1a8,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)c_local,
                 (long)(local_28->
                       super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
                       super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                       .m_data);
      householderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>>
                (&local_138,(Eigen *)&local_170,
                 (Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true> *)&local_1a8,h)
      ;
      HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
      ::transpose(&local_b0,&local_138);
      MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      applyOnTheLeft<Eigen::HouseholderSequence<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>,1>>
                ((MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)this,
                 (EigenBase<Eigen::HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>_>
                  *)&local_b0);
      DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<long,long>
                (&local_218,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)hCoeffs_local,
                 (long)(local_28->
                       super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
                       super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                       .m_data,
                 (long)(local_28->
                       super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
                       super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                       .m_data);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>>::
      triangularView<2u>(&local_1e0,&local_218);
      DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::head<long>
                (&local_250,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)rank_local,
                 (long)(local_28->
                       super_Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
                       super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                       .m_data);
      TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>const,2u,Eigen::Dense>
      ::solveInPlace<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,1,false>>
                ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>const,2u,Eigen::Dense>
                  *)&local_1e0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &local_250);
      return;
    }
    __assert_fail("mat.cols() >= rank",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x124,
                  "void Eigen::internal::nnls_householder_qr_inplace_solve(const MatrixQR &, const HCoeffs &, Dest &, typename MatrixQR::Index &) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, Dest = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  __assert_fail("mat.cols() == hCoeffs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                ,0x123,
                "void Eigen::internal::nnls_householder_qr_inplace_solve(const MatrixQR &, const HCoeffs &, Dest &, typename MatrixQR::Index &) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, Dest = Eigen::Matrix<float, -1, 1>]"
               );
}

Assistant:

void nnls_householder_qr_inplace_solve(const MatrixQR& mat, const HCoeffs &hCoeffs,
                                       Dest &c, typename MatrixQR::Index &rank)
{
  eigen_assert(mat.rows() == c.size());
  eigen_assert(mat.cols() == hCoeffs.size());
  eigen_assert(mat.cols() >= rank);

  c.applyOnTheLeft(householderSequence(
    mat.leftCols(rank),
    hCoeffs.head(rank)).transpose());

  mat.topLeftCorner(rank, rank)
     .template triangularView<Upper>()
     .solveInPlace(c.head(rank));
}